

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::type_name(Option *this,string *typeval)

{
  Option *in_RDI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffff88;
  anon_class_32_1_50816887 *__f;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  __f = (anon_class_32_1_50816887 *)&stack0xffffffffffffffb0;
  ::std::__cxx11::string::string
            (in_stack_ffffffffffffffd0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc8);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Option::type_name(std::__cxx11::string)::_lambda()_1_,void>
            (in_stack_ffffffffffffffa0,__f);
  type_name_fn(in_RDI,in_stack_ffffffffffffff88);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x1cee23);
  type_name(std::__cxx11::string)::{lambda()#1}::~basic_string((anon_class_32_1_50816887 *)0x1cee2d)
  ;
  return in_RDI;
}

Assistant:

Option *type_name(std::string typeval) {
        type_name_fn([typeval]() { return typeval; });
        return this;
    }